

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_builder.h
# Opt level: O0

Fantasy_Character_union_ref_t
Fantasy_Character_clone(flatbuffers_builder_t *B,Fantasy_Character_union_t u)

{
  flatbuffers_union_type_t fVar1;
  Fantasy_Attacker_ref_t ref;
  Fantasy_Rapunzel_ref_t ref_00;
  Fantasy_BookReader_ref_t FVar2;
  flatbuffers_string_ref_t fVar3;
  Fantasy_Rapunzel_struct_t p;
  flatbuffers_builder_t *B_local;
  Fantasy_Character_union_t u_local;
  
  p = (Fantasy_Rapunzel_struct_t)u.value;
  fVar1 = u.type;
  if (fVar1 == '\x02') {
    ref = Fantasy_Attacker_clone(B,(Fantasy_Attacker_table_t)p);
    u_local.value = (flatbuffers_generic_t)Fantasy_Character_as_MuLan(ref);
  }
  else if (fVar1 == '\b') {
    ref_00 = Fantasy_Rapunzel_clone(B,p);
    u_local.value = (flatbuffers_generic_t)Fantasy_Character_as_Rapunzel(ref_00);
  }
  else if (fVar1 == '\t') {
    FVar2 = Fantasy_BookReader_clone(B,(Fantasy_BookReader_struct_t)p);
    u_local.value = (flatbuffers_generic_t)Fantasy_Character_as_Belle(FVar2);
  }
  else if (fVar1 == '\n') {
    FVar2 = Fantasy_BookReader_clone(B,(Fantasy_BookReader_struct_t)p);
    u_local.value = (flatbuffers_generic_t)Fantasy_Character_as_BookFan(FVar2);
  }
  else if (fVar1 == '\v') {
    fVar3 = flatbuffers_string_clone(B,(flatbuffers_string_t)p);
    u_local.value = (flatbuffers_generic_t)Fantasy_Character_as_Other(fVar3);
  }
  else if (fVar1 == 0xff) {
    fVar3 = flatbuffers_string_clone(B,(flatbuffers_string_t)p);
    u_local.value = (flatbuffers_generic_t)Fantasy_Character_as_Unused(fVar3);
  }
  else {
    u_local.value = (flatbuffers_generic_t)Fantasy_Character_as_NONE();
  }
  return (Fantasy_Character_union_ref_t)u_local.value;
}

Assistant:

static Fantasy_Character_union_ref_t Fantasy_Character_clone(flatbuffers_builder_t *B, Fantasy_Character_union_t u)
{
    switch (u.type) {
    case 2: return Fantasy_Character_as_MuLan(Fantasy_Attacker_clone(B, (Fantasy_Attacker_table_t)u.value));
    case 8: return Fantasy_Character_as_Rapunzel(Fantasy_Rapunzel_clone(B, (Fantasy_Rapunzel_struct_t)u.value));
    case 9: return Fantasy_Character_as_Belle(Fantasy_BookReader_clone(B, (Fantasy_BookReader_struct_t)u.value));
    case 10: return Fantasy_Character_as_BookFan(Fantasy_BookReader_clone(B, (Fantasy_BookReader_struct_t)u.value));
    case 11: return Fantasy_Character_as_Other(flatbuffers_string_clone(B, u.value));
    case 255: return Fantasy_Character_as_Unused(flatbuffers_string_clone(B, u.value));
    default: return Fantasy_Character_as_NONE();
    }
}